

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

char * nng_http_get_header(nng_http *conn,char *key)

{
  char *pcVar1;
  
  pcVar1 = nni_http_get_header(conn,key);
  return pcVar1;
}

Assistant:

const char *
nng_http_get_header(nng_http *conn, const char *key)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_get_header(conn, key));
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(key);
	return (NULL);
#endif
}